

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
bwtil::IndexedBWT::convertToTextCoordinates
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          IndexedBWT *this,pair<unsigned_long,_unsigned_long> interval)

{
  iterator __position;
  ulint i;
  uint uVar1;
  ulint local_30;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (uint)interval.first;
  i = interval.first & 0xffffffff;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (i < interval.second) {
    do {
      uVar1 = uVar1 + 1;
      local_30 = convertToTextCoordinate(this,i);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (__return_storage_ptr__,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      i = (ulint)uVar1;
    } while (i < interval.second);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ulint> convertToTextCoordinates(pair<ulint, ulint> interval){

		vector<ulint> coord;
		for(uint i=interval.first;i<interval.second;i++)
			coord.push_back( convertToTextCoordinate(i) );

		return coord;

	}